

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_slice.c
# Opt level: O0

ALLEGRO_FILE * al_fopen_slice(ALLEGRO_FILE *fp,size_t initial_size,char *mode)

{
  size_t *userdata_00;
  char *pcVar1;
  size_t sVar2;
  ALLEGRO_FILE *pAVar3;
  ALLEGRO_FILE_INTERFACE *in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  SLICE_DATA *userdata;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_fffffffffffffff8;
  
  userdata_00 = (size_t *)
                al_calloc_with_context
                          (in_stack_fffffffffffffff8,in_RDI,(int)(in_RSI >> 0x20),(char *)in_RDX,
                           in_stack_ffffffffffffffd8);
  if (userdata_00 != (size_t *)0x0) {
    pcVar1 = strstr((char *)in_RDX,"r");
    if ((pcVar1 != (char *)0x0) || (pcVar1 = strstr((char *)in_RDX,"R"), pcVar1 != (char *)0x0)) {
      *(uint *)(userdata_00 + 4) = (uint)userdata_00[4] | 1;
    }
    pcVar1 = strstr((char *)in_RDX,"w");
    if ((pcVar1 != (char *)0x0) || (pcVar1 = strstr((char *)in_RDX,"W"), pcVar1 != (char *)0x0)) {
      *(uint *)(userdata_00 + 4) = (uint)userdata_00[4] | 2;
    }
    pcVar1 = strstr((char *)in_RDX,"e");
    if ((pcVar1 != (char *)0x0) || (pcVar1 = strstr((char *)in_RDX,"E"), pcVar1 != (char *)0x0)) {
      *(uint *)(userdata_00 + 4) = (uint)userdata_00[4] | 4;
    }
    *userdata_00 = in_RDI;
    sVar2 = al_ftell((ALLEGRO_FILE *)0x1762a5);
    userdata_00[1] = sVar2;
    userdata_00[3] = in_RSI;
    pAVar3 = al_create_file_handle(in_RDX,userdata_00);
    return pAVar3;
  }
  return (ALLEGRO_FILE *)0x0;
}

Assistant:

ALLEGRO_FILE *al_fopen_slice(ALLEGRO_FILE *fp, size_t initial_size, const char *mode)
{
   SLICE_DATA *userdata = al_calloc(1, sizeof(*userdata));
   
   if (!userdata) {
      return NULL;
   }
   
   if (strstr(mode, "r") || strstr(mode, "R")) {
      userdata->mode |= SLICE_READ;
   }
   
   if (strstr(mode, "w") || strstr(mode, "W")) {
      userdata->mode |= SLICE_WRITE;
   }
   
   if (strstr(mode, "e") || strstr(mode, "E")) {
      userdata->mode |= SLICE_EXPANDABLE;
   }
   
   userdata->fp = fp;
   userdata->anchor = al_ftell(fp);
   userdata->size = initial_size;
   
   return al_create_file_handle(&fi, userdata);
}